

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

int array_container_try_add(array_container_t *arr,uint16_t value,int32_t max_cardinality)

{
  _Bool _Var1;
  int32_t iVar2;
  int iVar3;
  int in_EDX;
  undefined2 in_SI;
  array_container_t *in_RDI;
  int32_t insert_idx;
  int32_t loc;
  int32_t cardinality;
  undefined4 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  int32_t lenarray;
  undefined2 in_stack_ffffffffffffffec;
  int32_t min;
  ushort ikey;
  uint16_t uVar4;
  int local_4;
  
  min = CONCAT22(in_SI,in_stack_ffffffffffffffec);
  lenarray = in_RDI->cardinality;
  _Var1 = array_container_empty(in_RDI);
  ikey = (ushort)((uint)min >> 0x10);
  if (((_Var1) || (in_RDI->array[lenarray + -1] < ikey)) && (lenarray < in_EDX)) {
    array_container_append
              ((array_container_t *)CONCAT44(lenarray,in_stack_ffffffffffffffe0),
               (uint16_t)((uint)in_stack_ffffffffffffffdc >> 0x10));
    local_4 = 1;
  }
  else {
    iVar2 = binarySearch(in_RDI->array,lenarray,ikey);
    if (iVar2 < 0) {
      if (lenarray < in_EDX) {
        _Var1 = array_container_full(in_RDI);
        if (_Var1) {
          array_container_grow(in_RDI,min,SUB41((uint)in_EDX >> 0x18,0));
        }
        uVar4 = (uint16_t)((uint)min >> 0x10);
        iVar3 = -1 - iVar2;
        memmove(in_RDI->array + (long)iVar3 + 1,in_RDI->array + iVar3,(long)(lenarray - iVar3) << 1)
        ;
        in_RDI->array[iVar3] = uVar4;
        in_RDI->cardinality = in_RDI->cardinality + 1;
        local_4 = 1;
      }
      else {
        local_4 = -1;
      }
    }
    else {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static inline int array_container_try_add(array_container_t *arr,
                                          uint16_t value,
                                          int32_t max_cardinality) {
    const int32_t cardinality = arr->cardinality;

    // best case, we can append.
    if ((array_container_empty(arr) || arr->array[cardinality - 1] < value) &&
        cardinality < max_cardinality) {
        array_container_append(arr, value);
        return 1;
    }

    const int32_t loc = binarySearch(arr->array, cardinality, value);

    if (loc >= 0) {
        return 0;
    } else if (cardinality < max_cardinality) {
        if (array_container_full(arr)) {
            array_container_grow(arr, arr->capacity + 1, true);
        }
        const int32_t insert_idx = -loc - 1;
        memmove(arr->array + insert_idx + 1, arr->array + insert_idx,
                (cardinality - insert_idx) * sizeof(uint16_t));
        arr->array[insert_idx] = value;
        arr->cardinality++;
        return 1;
    } else {
        return -1;
    }
}